

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::mark_eliminated_clauses_as_garbage
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer ppCVar1;
  pointer ppCVar2;
  pointer pvVar3;
  pointer ppCVar4;
  uint pivot_00;
  uint uVar5;
  uint uVar6;
  Clause **c;
  pointer ppCVar7;
  Clause *pCVar8;
  Clause **d;
  Occs *__range1_1;
  Occs *__range1;
  
  ppCVar1 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (eliminator->gates).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pivot_00 = -pivot;
  uVar6 = pivot;
  if (pivot < 1) {
    uVar6 = pivot_00;
  }
  uVar5 = uVar6 << 1 | (uint)pivot >> 0x1f;
  pvVar3 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = *(pointer *)
             ((long)&pvVar3[uVar5].
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  for (ppCVar7 = pvVar3[uVar5].
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar7 != ppCVar4; ppCVar7 = ppCVar7 + 1) {
    pCVar8 = *ppCVar7;
    if ((*(uint *)&pCVar8->field_0x8 & 0x10) == 0) {
      if ((ppCVar2 == ppCVar1) || ((*(uint *)&pCVar8->field_0x8 & 0x20) != 0)) {
        if (this->proof != (Proof *)0x0) {
          Proof::weaken_minus(this->proof,pCVar8);
          pCVar8 = *ppCVar7;
        }
        if (pCVar8->size == 2) {
          *deleted_binary_clause = true;
        }
        External::push_clause_on_extension_stack(this->external,pCVar8,pivot);
        pCVar8 = *ppCVar7;
      }
      mark_garbage(this,pCVar8);
      elim_update_removed_clause(this,eliminator,*ppCVar7,pivot);
    }
  }
  erase_vector<CaDiCaL::Clause*>(pvVar3 + uVar5);
  uVar6 = uVar6 << 1 | pivot_00 >> 0x1f;
  pvVar3 = (this->otab).
           super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = *(pointer *)
             ((long)&pvVar3[uVar6].
                     super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  for (ppCVar7 = pvVar3[uVar6].
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar7 != ppCVar4; ppCVar7 = ppCVar7 + 1) {
    pCVar8 = *ppCVar7;
    if ((*(uint *)&pCVar8->field_0x8 & 0x10) == 0) {
      if ((ppCVar2 == ppCVar1) || ((*(uint *)&pCVar8->field_0x8 & 0x20) != 0)) {
        if (this->proof != (Proof *)0x0) {
          Proof::weaken_minus(this->proof,pCVar8);
          pCVar8 = *ppCVar7;
        }
        if (pCVar8->size == 2) {
          *deleted_binary_clause = true;
        }
        External::push_clause_on_extension_stack(this->external,pCVar8,pivot_00);
        pCVar8 = *ppCVar7;
      }
      mark_garbage(this,pCVar8);
      elim_update_removed_clause(this,eliminator,*ppCVar7,pivot_00);
    }
  }
  erase_vector<CaDiCaL::Clause*>(pvVar3 + uVar6);
  return;
}

Assistant:

void Internal::mark_eliminated_clauses_as_garbage (
    Eliminator &eliminator, int pivot, bool &deleted_binary_clause) {
  assert (!unsat);

  LOG ("marking irredundant clauses with %d as garbage", pivot);

  const int64_t substitute = eliminator.gates.size ();
  if (substitute)
    LOG ("pushing %" PRId64 " gate clauses on extension stack", substitute);
#ifndef NDEBUG
  int64_t pushed = 0;
#endif
  Occs &ps = occs (pivot);
  for (const auto &c : ps) {
    if (c->garbage)
      continue;
    assert (!c->redundant);
    if (!substitute || c->gate) {
      if (proof)
        proof->weaken_minus (c);
      if (c->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (c, pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (c);
    elim_update_removed_clause (eliminator, c, pivot);
  }
  erase_occs (ps);

  LOG ("marking irredundant clauses with %d as garbage", -pivot);

  Occs &ns = occs (-pivot);
  for (const auto &d : ns) {
    if (d->garbage)
      continue;
    assert (!d->redundant);
    if (!substitute || d->gate) {
      if (proof)
        proof->weaken_minus (d);
      if (d->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (d, -pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (d);
    elim_update_removed_clause (eliminator, d, -pivot);
  }
  erase_occs (ns);

  if (substitute)
    assert (pushed <= substitute);

  // Unfortunately, we can not use the trick by Niklas Soerensson anymore,
  // which avoids saving all clauses on the extension stack.  This would
  // break our new incremental 'restore' logic.
}